

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_decoder.cc
# Opt level: O3

void __thiscall draco::DirectBitDecoder::~DirectBitDecoder(DirectBitDecoder *this)

{
  pointer puVar1;
  
  puVar1 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this->num_used_bits_ = 0;
  (this->pos_)._M_current = puVar1;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->bits_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

DirectBitDecoder::~DirectBitDecoder() { Clear(); }